

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory64Lowering.cpp
# Opt level: O3

void __thiscall wasm::Memory64Lowering::visitTableCopy(Memory64Lowering *this,TableCopy *curr)

{
  wrapAddress64(this,&curr->dest,(Name)(curr->destTable).super_IString.str,true);
  wrapAddress64(this,&curr->source,(Name)(curr->sourceTable).super_IString.str,true);
  wrapAddress64(this,&curr->size,(Name)(curr->destTable).super_IString.str,true);
  return;
}

Assistant:

void visitTableCopy(TableCopy* curr) {
    wrapTableAddress64(curr->dest, curr->destTable);
    wrapTableAddress64(curr->source, curr->sourceTable);
    wrapTableAddress64(curr->size, curr->destTable);
  }